

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cCMYK,cBGRA,bSubtract>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  BYTE BVar14;
  int iVar15;
  ulong uVar16;
  byte *pbVar17;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0058ee2b_caseD_0:
    lVar12 = 0;
    if (count < 1) {
      count = 0;
    }
    pbVar17 = pin + 3;
    for (; count != (int)lVar12; lVar12 = lVar12 + 1) {
      iVar11 = (uint)pout[lVar12 * 4 + 2] * 0x10000 -
               (uint)(byte)(*pbVar17 - (char)((0x100 - (uint)pbVar17[-3]) * (uint)*pbVar17 >> 8)) *
               inf->alpha;
      if (iVar11 >> 0x10 < 1) {
        iVar11 = 0;
      }
      pout[lVar12 * 4 + 2] = (BYTE)((uint)iVar11 >> 0x10);
      iVar11 = (uint)pout[lVar12 * 4 + 1] * 0x10000 -
               (uint)(byte)(*pbVar17 - (char)((0x100 - (uint)pbVar17[-2]) * (uint)*pbVar17 >> 8)) *
               inf->alpha;
      if (iVar11 >> 0x10 < 1) {
        iVar11 = 0;
      }
      pout[lVar12 * 4 + 1] = (BYTE)((uint)iVar11 >> 0x10);
      iVar11 = (uint)pout[lVar12 * 4] * 0x10000 -
               (uint)(byte)(*pbVar17 - (char)((0x100 - (uint)pbVar17[-1]) * (uint)*pbVar17 >> 8)) *
               inf->alpha;
      if (iVar11 >> 0x10 < 1) {
        iVar11 = 0;
      }
      pout[lVar12 * 4] = (BYTE)((uint)iVar11 >> 0x10);
      pout[lVar12 * 4 + 3] = 0xff;
      pbVar17 = pbVar17 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0058ee2b_caseD_0;
    case BLEND_ICEMAP:
      lVar12 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar12; lVar12 = lVar12 + 1) {
        iVar7 = cCMYK::Gray(pin);
        iVar7 = iVar7 >> 4;
        iVar11 = (uint)pout[lVar12 * 4 + 2] * 0x10000 - (uint)IcePalette[iVar7][0] * inf->alpha;
        if (iVar11 >> 0x10 < 1) {
          iVar11 = 0;
        }
        pout[lVar12 * 4 + 2] = (BYTE)((uint)iVar11 >> 0x10);
        iVar11 = (uint)pout[lVar12 * 4 + 1] * 0x10000 - (uint)IcePalette[iVar7][1] * inf->alpha;
        if (iVar11 >> 0x10 < 1) {
          iVar11 = 0;
        }
        pout[lVar12 * 4 + 1] = (BYTE)((uint)iVar11 >> 0x10);
        iVar11 = (uint)pout[lVar12 * 4] * 0x10000 - (uint)IcePalette[iVar7][2] * inf->alpha;
        if (iVar11 >> 0x10 < 1) {
          iVar11 = 0;
        }
        pout[lVar12 * 4] = (BYTE)((uint)iVar11 >> 0x10);
        pout[lVar12 * 4 + 3] = 0xff;
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      if (count < 1) {
        count = 0;
      }
      pbVar17 = pin + 3;
      for (lVar12 = 0; count != (int)lVar12; lVar12 = lVar12 + 1) {
        bVar1 = *pbVar17;
        iVar11 = inf->blendcolor[3];
        bVar2 = pbVar17[-2];
        iVar7 = inf->blendcolor[1];
        bVar3 = pbVar17[-1];
        iVar9 = inf->blendcolor[2];
        iVar15 = (uint)pout[lVar12 * 4 + 2] * 0x10000 -
                 ((uint)(byte)(bVar1 - (char)((0x100 - (uint)pbVar17[-3]) * (uint)bVar1 >> 8)) *
                  iVar11 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha;
        BVar14 = (BYTE)((uint)iVar15 >> 0x10);
        if (iVar15 >> 0x10 < 1) {
          BVar14 = '\0';
        }
        pout[lVar12 * 4 + 2] = BVar14;
        iVar7 = (uint)pout[lVar12 * 4 + 1] * 0x10000 -
                ((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar2) * (uint)bVar1 >> 8)) * iVar11 +
                 iVar7 >> 0x10 & 0xff) * inf->alpha;
        BVar14 = (BYTE)((uint)iVar7 >> 0x10);
        if (iVar7 >> 0x10 < 1) {
          BVar14 = '\0';
        }
        pout[lVar12 * 4 + 1] = BVar14;
        iVar11 = (uint)pout[lVar12 * 4] * 0x10000 -
                 ((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar3) * (uint)bVar1 >> 8)) * iVar11 +
                  iVar9 >> 0x10 & 0xff) * inf->alpha;
        BVar14 = (BYTE)((uint)iVar11 >> 0x10);
        if (iVar11 >> 0x10 < 1) {
          BVar14 = '\0';
        }
        pout[lVar12 * 4] = BVar14;
        pout[lVar12 * 4 + 3] = 0xff;
        pbVar17 = pbVar17 + step;
      }
      break;
    case BLEND_MODULATE:
      if (count < 1) {
        count = 0;
      }
      pbVar17 = pin + 3;
      for (lVar12 = 0; count != (int)lVar12; lVar12 = lVar12 + 1) {
        bVar1 = *pbVar17;
        bVar2 = pbVar17[-2];
        iVar11 = inf->blendcolor[1];
        bVar3 = pbVar17[-1];
        iVar7 = inf->blendcolor[2];
        iVar9 = (uint)pout[lVar12 * 4 + 2] * 0x10000 -
                ((uint)(byte)(bVar1 - (char)((0x100 - (uint)pbVar17[-3]) * (uint)bVar1 >> 8)) *
                 inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha;
        BVar14 = (BYTE)((uint)iVar9 >> 0x10);
        if (iVar9 >> 0x10 < 1) {
          BVar14 = '\0';
        }
        pout[lVar12 * 4 + 2] = BVar14;
        iVar11 = (uint)pout[lVar12 * 4 + 1] * 0x10000 -
                 ((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar2) * (uint)bVar1 >> 8)) * iVar11 >>
                  0x10 & 0xff) * inf->alpha;
        BVar14 = (BYTE)((uint)iVar11 >> 0x10);
        if (iVar11 >> 0x10 < 1) {
          BVar14 = '\0';
        }
        pout[lVar12 * 4 + 1] = BVar14;
        iVar11 = (uint)pout[lVar12 * 4] * 0x10000 -
                 ((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar3) * (uint)bVar1 >> 8)) * iVar7 >>
                  0x10 & 0xff) * inf->alpha;
        BVar14 = (BYTE)((uint)iVar11 >> 0x10);
        if (iVar11 >> 0x10 < 1) {
          BVar14 = '\0';
        }
        pout[lVar12 * 4] = BVar14;
        pout[lVar12 * 4 + 3] = 0xff;
        pbVar17 = pbVar17 + step;
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar12 = (long)EVar4;
      if (lVar12 < 0x21) {
        if (BLEND_ICEMAP < EVar4) {
          iVar11 = 0x20 - EVar4;
          if (count < 1) {
            count = 0;
          }
          for (lVar12 = 0; count != (int)lVar12; lVar12 = lVar12 + 1) {
            iVar7 = cCMYK::Gray(pin);
            bVar1 = pin[3];
            iVar7 = iVar7 * (EVar4 + BLEND_MODULATE);
            bVar2 = pin[1];
            bVar3 = pin[2];
            iVar9 = (uint)pout[lVar12 * 4 + 2] * 0x10000 -
                    ((int)((uint)(byte)(bVar1 - (char)((0x100 - (uint)*pin) * (uint)bVar1 >> 8)) *
                           iVar11 + iVar7) / 0x1f & 0xffU) * inf->alpha;
            BVar14 = (BYTE)((uint)iVar9 >> 0x10);
            if (iVar9 >> 0x10 < 1) {
              BVar14 = '\0';
            }
            pout[lVar12 * 4 + 2] = BVar14;
            iVar9 = (uint)pout[lVar12 * 4 + 1] * 0x10000 -
                    ((int)((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar2) * (uint)bVar1 >> 8)) *
                           iVar11 + iVar7) / 0x1f & 0xffU) * inf->alpha;
            BVar14 = (BYTE)((uint)iVar9 >> 0x10);
            if (iVar9 >> 0x10 < 1) {
              BVar14 = '\0';
            }
            pout[lVar12 * 4 + 1] = BVar14;
            iVar7 = (uint)pout[lVar12 * 4] * 0x10000 -
                    ((int)((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar3) * (uint)bVar1 >> 8)) *
                           iVar11 + iVar7) / 0x1f & 0xffU) * inf->alpha;
            BVar14 = (BYTE)((uint)iVar7 >> 0x10);
            if (iVar7 >> 0x10 < 1) {
              BVar14 = '\0';
            }
            pout[lVar12 * 4] = BVar14;
            pout[lVar12 * 4 + 3] = 0xff;
            pin = pin + step;
          }
        }
      }
      else {
        uVar13 = 0;
        uVar16 = (ulong)(uint)count;
        if (count < 1) {
          uVar16 = uVar13;
        }
        for (; (int)uVar16 != (int)uVar13; uVar13 = uVar13 + 1) {
          uVar6 = cCMYK::Gray(pin);
          uVar8 = 0xff;
          if (uVar6 < 0xff) {
            uVar8 = uVar6;
          }
          uVar10 = (ulong)uVar8;
          if ((int)uVar6 < 1) {
            uVar10 = 0;
          }
          iVar11 = (uint)pout[uVar13 * 4 + 2] * 0x10000 -
                   (uint)*(byte *)((long)pFVar5 + uVar10 * 4 + lVar12 * 0x518 + -0xa6fe) *
                   inf->alpha;
          if (iVar11 >> 0x10 < 1) {
            iVar11 = 0;
          }
          bVar1 = *(byte *)((long)pFVar5 + uVar10 * 4 + lVar12 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar5 + uVar10 * 4 + lVar12 * 0x518 + -0xa6ff);
          pout[uVar13 * 4 + 2] = (BYTE)((uint)iVar11 >> 0x10);
          iVar11 = (uint)pout[uVar13 * 4 + 1] * 0x10000 - (uint)bVar2 * inf->alpha;
          if (iVar11 >> 0x10 < 1) {
            iVar11 = 0;
          }
          pout[uVar13 * 4 + 1] = (BYTE)((uint)iVar11 >> 0x10);
          iVar11 = (uint)pout[uVar13 * 4] * 0x10000 - (uint)bVar1 * inf->alpha;
          if (iVar11 >> 0x10 < 1) {
            iVar11 = 0;
          }
          pout[uVar13 * 4] = (BYTE)((uint)iVar11 >> 0x10);
          pout[uVar13 * 4 + 3] = 0xff;
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}